

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O2

ion_err_t dictionary_build_predicate(ion_predicate_t *predicate,ion_predicate_type_t type,...)

{
  code *pcVar1;
  ion_key_t in_RDX;
  long lVar2;
  undefined8 local_a8;
  undefined8 local_a0;
  va_list arg_list;
  
  predicate->type = (ion_predicate_type_t)_type;
  if (_type == 2) {
    pcVar1 = dictionary_destroy_predicate_all_records;
  }
  else {
    if (_type == 1) {
      (predicate->statement).equality.equality_value = in_RDX;
      pcVar1 = dictionary_destroy_predicate_range;
      lVar2 = 0x10;
      local_a8 = local_a0;
    }
    else {
      if (_type != 0) {
        return '\x05';
      }
      pcVar1 = dictionary_destroy_predicate_equality;
      lVar2 = 8;
    }
    *(undefined8 *)(&predicate->type + lVar2) = local_a8;
  }
  predicate->destroy = pcVar1;
  return '\0';
}

Assistant:

ion_err_t
dictionary_build_predicate(
	ion_predicate_t			*predicate,
	ion_predicate_type_t	type,
	...
) {
	va_list arg_list;

	va_start(arg_list, type);

	predicate->type = type;

	switch (type) {
		case predicate_equality: {
			ion_key_t key = va_arg(arg_list, ion_key_t);

			predicate->statement.equality.equality_value	= key;
			predicate->destroy								= dictionary_destroy_predicate_equality;
			break;
		}

		case predicate_range: {
			ion_key_t	lower_bound = va_arg(arg_list, ion_key_t);
			ion_key_t	upper_bound = va_arg(arg_list, ion_key_t);

			predicate->statement.range.lower_bound	= lower_bound;
			predicate->statement.range.upper_bound	= upper_bound;
			predicate->destroy						= dictionary_destroy_predicate_range;
			break;
		}

		case predicate_all_records: {
			predicate->destroy = dictionary_destroy_predicate_all_records;
			break;
		}

		case predicate_predicate: {
			return err_invalid_predicate;
		}

		default: {
			return err_invalid_predicate;
			break;
		}
	}

	va_end(arg_list);
	return err_ok;
}